

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

void __thiscall BasePort::BasePort(BasePort *this,int portNum,ostream *ostr)

{
  ulong local_28;
  size_t i;
  ostream *ostr_local;
  int portNum_local;
  BasePort *this_local;
  
  this->_vptr_BasePort = (_func_int **)&PTR___cxa_pure_virtual_001326e8;
  this->outStr = ostr;
  this->Protocol_ = PROTOCOL_SEQ_RW;
  this->IsAllBoardsBroadcastCapable_ = false;
  this->IsAllBoardsRev4_5_ = false;
  this->IsAllBoardsRev4_6_ = false;
  this->IsAllBoardsRev6_ = false;
  this->IsAllBoardsRev7_ = false;
  this->IsAllBoardsRev8_9_ = false;
  this->ReadErrorCounter_ = 0;
  this->PortNum = portNum;
  this->FwBusGeneration = 0;
  this->newFwBusGeneration = 0;
  this->autoReScan = true;
  this->NumOfNodes_ = 0;
  this->NumOfBoards_ = 0;
  this->BoardInUseMask_ = 0;
  this->max_board = 0;
  this->HubBoard = '\x10';
  BroadcastReadInfo::BroadcastReadInfo(&this->bcReadInfo);
  for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 1) {
    this->BoardList[local_28] = (BoardIO *)0x0;
    this->FirmwareVersion[local_28] = 0;
    this->FpgaVersion[local_28] = 0;
    this->HardwareVersion[local_28] = 0;
    this->Board2Node[local_28] = 0x40;
  }
  this->ReadBufferBroadcast = (uchar *)0x0;
  this->WriteBufferBroadcast = (uchar *)0x0;
  this->GenericBuffer = (uchar *)0x0;
  for (local_28 = 0; local_28 < 0x40; local_28 = local_28 + 1) {
    this->Node2Board[local_28] = '\x10';
  }
  AddHardwareVersion(0x514c4131);
  AddHardwareVersion(0x64524131);
  AddHardwareVersion(0x44514c41);
  AddHardwareVersion(0x42434647);
  AddHardwareVersion(0x54455354);
  return;
}

Assistant:

BasePort::BasePort(int portNum, std::ostream &ostr):
        outStr(ostr),
        Protocol_(BasePort::PROTOCOL_SEQ_RW),
        IsAllBoardsBroadcastCapable_(false),
        IsAllBoardsRev4_5_(false),
        IsAllBoardsRev4_6_(false),
        IsAllBoardsRev6_(false),
        IsAllBoardsRev7_(false),
        IsAllBoardsRev8_9_(false),
        ReadErrorCounter_(0),
        PortNum(portNum),
        FwBusGeneration(0),
        newFwBusGeneration(0),
        autoReScan(true),
        NumOfNodes_(0),
        NumOfBoards_(0),
        BoardInUseMask_(0),
        max_board(0),
        HubBoard(BoardIO::MAX_BOARDS)
{
    size_t i;
    for (i = 0; i < BoardIO::MAX_BOARDS; i++) {
        BoardList[i] = 0;
        FirmwareVersion[i] = 0;
        FpgaVersion[i] = 0;
        HardwareVersion[i] = 0;
        Board2Node[i] = MAX_NODES;
    }
    ReadBufferBroadcast = 0;
    WriteBufferBroadcast = 0;
    GenericBuffer = 0;
    for (i = 0; i < MAX_NODES; i++)
        Node2Board[i] = BoardIO::MAX_BOARDS;
    // Note that AddHardwareVersion will not add duplicates
    BasePort::AddHardwareVersion(QLA1_String);
    BasePort::AddHardwareVersion(dRA1_String);
    BasePort::AddHardwareVersion(DQLA_String);
    BasePort::AddHardwareVersion(BCFG_String);
    BasePort::AddHardwareVersion(0x54455354); // "TEST"
}